

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotScatterEx<ImPlot::GetterYs<unsigned_long_long>>
               (char *label_id,GetterYs<unsigned_long_long> *getter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar6;
  unsigned_long_long uVar7;
  unsigned_long_long *puVar8;
  double dVar9;
  uint uVar10;
  ImPlotRange *pIVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  float fVar19;
  GetterYs<unsigned_long_long> *pGVar20;
  double dVar21;
  double dVar22;
  float fVar23;
  unsigned_long_long *puVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined8 local_b8;
  float local_b0;
  float local_ac;
  GetterYs<unsigned_long_long> *local_a8;
  long local_a0;
  ImU32 local_94;
  ImU32 local_90;
  uint local_8c;
  long local_88;
  ulong local_80;
  double local_78;
  double local_70;
  unsigned_long_long *local_68;
  undefined8 local_60;
  ImDrawList *local_58;
  long local_50;
  undefined1 local_48 [16];
  
  bVar13 = BeginItem(label_id,2);
  pIVar12 = GImPlot;
  if (bVar13) {
    if ((GImPlot->FitThisFrame == true) && (iVar1 = getter->Count, 0 < iVar1)) {
      dVar22 = getter->X0;
      dVar21 = getter->XScale;
      puVar24 = getter->Ys;
      iVar17 = getter->Offset;
      iVar2 = getter->Stride;
      pIVar6 = GImPlot->CurrentPlot;
      iVar3 = pIVar6->CurrentYAxis;
      uVar4 = (pIVar6->XAxis).Flags;
      pIVar11 = GImPlot->ExtentsY;
      uVar5 = pIVar6->YAxis[iVar3].Flags;
      iVar18 = 0;
      uVar16 = uVar5 & 0x20;
      uVar10 = uVar16 >> 5;
      local_a0 = CONCAT44(local_a0._4_4_,uVar10);
      lVar14 = local_a0;
      local_60 = (ImPlotContext *)(CONCAT44(local_60._4_4_,uVar4) & 0xffffffff00000020);
      dVar25 = 0.0;
      do {
        dVar27 = dVar21 * dVar25 + dVar22;
        uVar7 = *(unsigned_long_long *)
                 ((long)puVar24 + (long)(((iVar17 + iVar18) % iVar1 + iVar1) % iVar1) * (long)iVar2)
        ;
        auVar29._8_4_ = (int)(uVar7 >> 0x20);
        auVar29._0_8_ = uVar7;
        auVar29._12_4_ = 0x45300000;
        dVar26 = (auVar29._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
        if ((uVar4 >> 10 & 1) == 0) {
          if ((long)ABS(dVar27) < 0x7ff0000000000000) {
LAB_001d4be8:
            if ((0.0 < dVar27) || ((int)local_60 == 0)) {
              dVar28 = (pIVar12->ExtentsX).Min;
              dVar9 = dVar27;
              if (dVar28 <= dVar27) {
                dVar9 = dVar28;
              }
              (pIVar12->ExtentsX).Min = dVar9;
              dVar28 = (pIVar12->ExtentsX).Max;
              dVar9 = dVar27;
              if (dVar27 <= dVar28) {
                dVar9 = dVar28;
              }
              (pIVar12->ExtentsX).Max = dVar9;
            }
          }
        }
        else if ((((long)ABS(dVar27) < 0x7ff0000000000000) &&
                 (pIVar6->YAxis[iVar3].Range.Min <= dVar26)) &&
                (dVar26 <= pIVar6->YAxis[iVar3].Range.Max)) goto LAB_001d4be8;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((uVar7 != 0) || (uVar16 == 0)) {
LAB_001d4c5a:
            dVar27 = pIVar11[iVar3].Min;
            dVar28 = dVar26;
            if (dVar27 <= dVar26) {
              dVar28 = dVar27;
            }
            pIVar11[iVar3].Min = dVar28;
            dVar27 = pIVar12->ExtentsY[iVar3].Max;
            if (dVar26 <= dVar27) {
              dVar26 = dVar27;
            }
            pIVar12->ExtentsY[iVar3].Max = dVar26;
          }
        }
        else if ((((pIVar6->XAxis).Range.Min <= dVar27) && (dVar27 <= (pIVar6->XAxis).Range.Max)) &&
                (local_a0._0_1_ = (byte)uVar10, (uVar7 == 0 & (byte)local_a0) == 0))
        goto LAB_001d4c5a;
        dVar25 = dVar25 + 1.0;
        iVar18 = iVar18 + 1;
        local_a0 = lVar14;
      } while (iVar1 != iVar18);
    }
    local_a8 = getter;
    local_58 = GetPlotDrawList();
    iVar1 = (pIVar12->NextItemData).Marker;
    iVar17 = 0;
    if (iVar1 != -1) {
      iVar17 = iVar1;
    }
    PopPlotClipRect();
    PushPlotClipRect((pIVar12->NextItemData).MarkerSize);
    local_90 = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 2);
    local_94 = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 3);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    lVar14 = (long)transformer.YAxis;
    local_60 = GImPlot;
    local_a0 = lVar14;
    switch(GImPlot->Scales[lVar14]) {
    case 0:
      iVar1 = local_a8->Count;
      if (0 < iVar1) {
        puVar8 = local_a8->Ys;
        dVar22 = local_a8->XScale;
        puVar24 = (unsigned_long_long *)local_a8->X0;
        uVar15 = (ulong)(uint)local_a8->Offset;
        local_70 = (double)CONCAT44(local_70._4_4_,(pIVar12->NextItemData).MarkerSize);
        local_78 = (double)CONCAT44(local_78._4_4_,(pIVar12->NextItemData).MarkerWeight);
        iVar2 = local_a8->Stride;
        local_88 = (long)iVar17;
        iVar17 = 0;
        pGVar20 = (GetterYs<unsigned_long_long> *)0x0;
        local_ac = (float)(uint)(pIVar12->NextItemData).RenderMarkerLine;
        local_b0 = (float)(uint)(pIVar12->NextItemData).RenderMarkerFill;
        local_48._0_8_ = dVar22;
        local_80 = uVar15;
        local_68 = puVar24;
        do {
          uVar7 = *(unsigned_long_long *)
                   ((long)puVar8 +
                   (long)((((int)uVar15 + iVar17) % iVar1 + iVar1) % iVar1) * (long)iVar2);
          fVar19 = (float)(((dVar22 * (double)pGVar20 + (double)puVar24) -
                           (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                          (double)GImPlot->PixelRange[lVar14].Min.x);
          fVar23 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar7 >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) -
                           GImPlot->CurrentPlot->YAxis[lVar14].Range.Min) * GImPlot->My[local_a0] +
                          (double)GImPlot->PixelRange[lVar14].Min.y);
          local_b8 = CONCAT44(fVar23,fVar19);
          pIVar6 = local_60->CurrentPlot;
          if ((((pIVar6->PlotRect).Min.x <= fVar19) && ((pIVar6->PlotRect).Min.y <= fVar23)) &&
             ((fVar19 < (pIVar6->PlotRect).Max.x && (fVar23 < (pIVar6->PlotRect).Max.y)))) {
            local_a8 = pGVar20;
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterYs<unsigned_long_long>>(ImPlot::GetterYs<unsigned_long_long>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_88 * 8))
                      ((ulong)local_70 & 0xffffffff,(ulong)local_78 & 0xffffffff,local_58,&local_b8,
                       local_ac,local_90,local_b0,local_94);
            uVar15 = local_80;
            dVar22 = (double)local_48._0_8_;
            puVar24 = local_68;
            pGVar20 = local_a8;
          }
          pGVar20 = (GetterYs<unsigned_long_long> *)((double)pGVar20 + 1.0);
          iVar17 = iVar17 + 1;
        } while (iVar1 != iVar17);
      }
      break;
    case 1:
      iVar1 = local_a8->Count;
      if (0 < iVar1) {
        local_68 = local_a8->Ys;
        local_70 = local_a8->XScale;
        local_78 = local_a8->X0;
        local_80 = (ulong)(uint)local_a8->Offset;
        local_ac = (pIVar12->NextItemData).MarkerSize;
        local_b0 = (pIVar12->NextItemData).MarkerWeight;
        local_88 = (long)local_a8->Stride;
        local_50 = (long)iVar17;
        iVar17 = 0;
        pGVar20 = (GetterYs<unsigned_long_long> *)0x0;
        local_8c = (uint)(pIVar12->NextItemData).RenderMarkerLine;
        bVar13 = (pIVar12->NextItemData).RenderMarkerFill;
        do {
          pIVar12 = GImPlot;
          uVar7 = *(unsigned_long_long *)
                   ((long)local_68 + ((((int)local_80 + iVar17) % iVar1 + iVar1) % iVar1) * local_88
                   );
          dVar22 = (double)CONCAT44(0x45300000,(int)(uVar7 >> 0x20)) - 1.9342813113834067e+25;
          local_48._8_4_ = SUB84(dVar22,0);
          local_48._0_8_ = dVar22 + ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
          local_48._12_4_ = (int)((ulong)dVar22 >> 0x20);
          local_a8 = pGVar20;
          dVar21 = log10((local_70 * (double)pGVar20 + local_78) /
                         (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar6 = pIVar12->CurrentPlot;
          dVar22 = (pIVar6->XAxis).Range.Min;
          fVar19 = (float)((((double)(float)(dVar21 / pIVar12->LogDenX) *
                             ((pIVar6->XAxis).Range.Max - dVar22) + dVar22) - dVar22) * pIVar12->Mx
                          + (double)pIVar12->PixelRange[lVar14].Min.x);
          fVar23 = (float)(((double)local_48._0_8_ - pIVar6->YAxis[lVar14].Range.Min) *
                           pIVar12->My[local_a0] + (double)pIVar12->PixelRange[lVar14].Min.y);
          local_b8 = CONCAT44(fVar23,fVar19);
          pIVar6 = local_60->CurrentPlot;
          if ((((pIVar6->PlotRect).Min.x <= fVar19) && ((pIVar6->PlotRect).Min.y <= fVar23)) &&
             ((fVar19 < (pIVar6->PlotRect).Max.x && (fVar23 < (pIVar6->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterYs<unsigned_long_long>>(ImPlot::GetterYs<unsigned_long_long>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_50 * 8))
                      (local_ac,local_b0,local_58,&local_b8,local_8c,local_90,bVar13,local_94);
          }
          pGVar20 = (GetterYs<unsigned_long_long> *)((double)local_a8 + 1.0);
          iVar17 = iVar17 + 1;
        } while (iVar1 != iVar17);
      }
      break;
    case 2:
      iVar1 = local_a8->Count;
      if (0 < iVar1) {
        local_68 = local_a8->Ys;
        local_70 = local_a8->XScale;
        local_78 = local_a8->X0;
        local_80 = (ulong)(uint)local_a8->Offset;
        local_ac = (pIVar12->NextItemData).MarkerSize;
        local_b0 = (pIVar12->NextItemData).MarkerWeight;
        local_88 = (long)local_a8->Stride;
        local_50 = (long)iVar17;
        iVar17 = 0;
        pGVar20 = (GetterYs<unsigned_long_long> *)0x0;
        local_8c = (uint)(pIVar12->NextItemData).RenderMarkerLine;
        bVar13 = (pIVar12->NextItemData).RenderMarkerFill;
        do {
          pIVar12 = GImPlot;
          local_48._0_8_ = local_70 * (double)pGVar20 + local_78;
          uVar7 = *(unsigned_long_long *)
                   ((long)local_68 + ((((int)local_80 + iVar17) % iVar1 + iVar1) % iVar1) * local_88
                   );
          local_a8 = pGVar20;
          dVar21 = log10((((double)CONCAT44(0x45300000,(int)(uVar7 >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) /
                         GImPlot->CurrentPlot->YAxis[lVar14].Range.Min);
          pIVar6 = pIVar12->CurrentPlot;
          dVar22 = pIVar6->YAxis[lVar14].Range.Min;
          fVar23 = (float)(((double)local_48._0_8_ - (pIVar6->XAxis).Range.Min) * pIVar12->Mx +
                          (double)pIVar12->PixelRange[lVar14].Min.x);
          fVar19 = (float)((((double)(float)(dVar21 / pIVar12->LogDenY[local_a0]) *
                             (pIVar6->YAxis[lVar14].Range.Max - dVar22) + dVar22) - dVar22) *
                           pIVar12->My[local_a0] + (double)pIVar12->PixelRange[lVar14].Min.y);
          local_b8 = CONCAT44(fVar19,fVar23);
          pIVar6 = local_60->CurrentPlot;
          if (((((pIVar6->PlotRect).Min.x <= fVar23) && ((pIVar6->PlotRect).Min.y <= fVar19)) &&
              (fVar23 < (pIVar6->PlotRect).Max.x)) && (fVar19 < (pIVar6->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterYs<unsigned_long_long>>(ImPlot::GetterYs<unsigned_long_long>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_50 * 8))
                      (local_ac,local_b0,local_58,&local_b8,local_8c,local_90,bVar13,local_94);
          }
          pGVar20 = (GetterYs<unsigned_long_long> *)((double)local_a8 + 1.0);
          iVar17 = iVar17 + 1;
        } while (iVar1 != iVar17);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<unsigned_long_long>>
                (*local_a8,transformer,local_58,iVar17,(pIVar12->NextItemData).MarkerSize,
                 (pIVar12->NextItemData).RenderMarkerLine,local_90,
                 (pIVar12->NextItemData).MarkerWeight,(pIVar12->NextItemData).RenderMarkerFill,
                 local_94);
    }
    pIVar12 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar12->NextItemData);
    pIVar12->PreviousItem = pIVar12->CurrentItem;
    pIVar12->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotScatterEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_MarkerOutline)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}